

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

ImplicitCallFlags
Js::JavascriptOperators::CheckAndUpdateFunctionBodyWithImplicitFlag(FunctionBody *functionBody)

{
  Type *pTVar1;
  ImplicitCallFlags IVar2;
  ScriptContext *pSVar3;
  
  pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  IVar2 = pSVar3->threadContext->implicitCallFlags;
  if (ImplicitCall_None < IVar2) {
    pTVar1 = &(functionBody->super_ParseableFunctionInfo).flags;
    *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|Flags_NonUserCode|
                         Flags_HasThis|Flags_HasTry|Flags_HasOrParentHasArguments|
                        Flags_StackNestedFunc);
  }
  return IVar2;
}

Assistant:

ImplicitCallFlags
    JavascriptOperators::CheckAndUpdateFunctionBodyWithImplicitFlag(FunctionBody* functionBody)
    {
        ScriptContext* scriptContext = functionBody->GetScriptContext();
        ImplicitCallFlags currImplicitCallFlags = scriptContext->GetThreadContext()->GetImplicitCallFlags();
        if ((currImplicitCallFlags > ImplicitCall_None))
        {
            functionBody->SetHasOnlyThisStmts(false);
        }
        return currImplicitCallFlags;
    }